

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-mock-test.cc
# Opt level: O2

void __thiscall LocaleTest_LocaleMock_Test::TestBody(LocaleTest_LocaleMock_Test *this)

{
  MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this_00;
  allocator local_239;
  MatcherBase<__locale_struct_*> local_238;
  MatcherBase<const_char_*> local_220;
  MatcherBase<int> local_208;
  string local_1f0;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  ScopedMock<LocaleMock> mock;
  
  ScopedMock<LocaleMock>::ScopedMock(&mock);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_208,0xde);
  std::__cxx11::string::string((string *)&local_1f0,"foo",&local_239);
  testing::StrEq(&local_1d0,&local_1f0);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_char_*> *)&local_220,(PolymorphicMatcher *)&local_1d0);
  testing::Matcher<__locale_struct_*>::Matcher
            ((Matcher<__locale_struct_*> *)&local_238,(__locale_struct *)&DAT_0000000b);
  this_00 = LocaleMock::gmock_newlocale
                      (&mock.super_StrictMock<LocaleMock>.super_LocaleMock,
                       (Matcher<int> *)&local_208,(Matcher<const_char_*> *)&local_220,
                       (Matcher<__locale_struct_*> *)&local_238);
  testing::internal::MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::
  InternalExpectedAt(this_00,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-mock-test.cc"
                     ,0x1fc,"mock","newlocale(222, StrEq(\"foo\"), locale)");
  testing::internal::MatcherBase<__locale_struct_*>::~MatcherBase(&local_238);
  testing::internal::MatcherBase<const_char_*>::~MatcherBase(&local_220);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_208);
  newlocale(0xde,"foo",(__locale_t)&DAT_0000000b);
  ScopedMock<LocaleMock>::~ScopedMock(&mock);
  return;
}

Assistant:

TEST(LocaleTest, LocaleMock) {
  ScopedMock<LocaleMock> mock;
  LocaleType locale = reinterpret_cast<LocaleType>(11);
  EXPECT_CALL(mock, newlocale(222, StrEq("foo"), locale));
  newlocale(222, "foo", locale);
}